

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFile.cpp
# Opt level: O0

void __thiscall LogFile::append_unlocked(LogFile *this,char *logline,int len)

{
  pointer pAVar1;
  int len_local;
  char *logline_local;
  LogFile *this_local;
  
  pAVar1 = std::unique_ptr<AppendFile,_std::default_delete<AppendFile>_>::operator->(&this->file_);
  AppendFile::append(pAVar1,logline,(long)len);
  this->count_ = this->count_ + 1;
  if (this->flushEveryN_ <= this->count_) {
    this->count_ = 0;
    pAVar1 = std::unique_ptr<AppendFile,_std::default_delete<AppendFile>_>::operator->(&this->file_)
    ;
    AppendFile::flush(pAVar1);
  }
  return;
}

Assistant:

void LogFile::append_unlocked(const char* logline, int len) {
    file_->append(logline, len);
    ++count_;
    if (count_>=flushEveryN_) {
        count_ = 0;
        file_->flush();
    }
}